

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86SHL(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,int num)

{
  uint uVar1;
  uchar *start;
  int shift_local;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  uchar *stream_local;
  
  if (size != sDWORD && size != sQWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x631,"int x86SHL(unsigned char *, x86Size, x86Reg, int, x86Reg, int, int)");
  }
  uVar1 = encodeRex(stream,size == sQWORD,rNONE,index,base);
  _index_local = stream + uVar1;
  if (num == 1) {
    *_index_local = 0xd1;
  }
  else {
    *_index_local = 0xc1;
  }
  _index_local = _index_local + 1;
  uVar1 = encodeAddress(_index_local,index,multiplier,base,shift,4);
  _index_local = _index_local + uVar1;
  if (num != 1) {
    uVar1 = encodeImmByte(_index_local,(char)num);
    _index_local = _index_local + uVar1;
  }
  return (int)_index_local - (int)stream;
}

Assistant:

int x86SHL(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, int num)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, rNONE, index, base);

	if(num == 1)
		*stream++ = 0xd1;
	else
		*stream++ = 0xc1;

	stream += encodeAddress(stream, index, multiplier, base, shift, 4);

	if(num != 1)
		stream += encodeImmByte(stream, (char)num);

	return int(stream - start);
}